

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

RegDemoState * __thiscall
despot::MemoryPool<despot::RegDemoState>::Allocate(MemoryPool<despot::RegDemoState> *this)

{
  value_type pRVar1;
  bool bVar2;
  reference ppRVar3;
  RegDemoState *obj;
  MemoryPool<despot::RegDemoState> *this_local;
  
  bVar2 = std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::empty
                    (&this->freelist_);
  if (bVar2) {
    NewChunk(this);
  }
  ppRVar3 = std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::back
                      (&this->freelist_);
  pRVar1 = *ppRVar3;
  std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::pop_back
            (&this->freelist_);
  bVar2 = MemoryObject::IsAllocated((MemoryObject *)&pRVar1->field_0x8);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    MemoryObject::SetAllocated((MemoryObject *)&pRVar1->field_0x8);
    this->num_allocated_ = this->num_allocated_ + 1;
    return pRVar1;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,
                "T *despot::MemoryPool<despot::RegDemoState>::Allocate() [T = despot::RegDemoState]"
               );
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}